

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::PostProcessFieldFeatures
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  string_view name;
  bool bVar1;
  FeatureSet_FieldPresence FVar2;
  FeatureSet_MessageEncoding FVar3;
  FieldOptions_CType FVar4;
  FeatureSet *pFVar5;
  Descriptor *pDVar6;
  MessageOptions *pMVar7;
  string *this_00;
  string_view relative_to;
  Symbol local_28;
  Symbol type;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  type.ptr_ = (SymbolBase *)proto;
  pFVar5 = FieldDescriptor::features(field);
  FVar2 = FeatureSet::field_presence(pFVar5);
  if ((FVar2 == FeatureSet_FieldPresence_LEGACY_REQUIRED) && ((byte)field->field_0x1 >> 6 == 1)) {
    field->field_0x1 = field->field_0x1 & 0x3f | 0x80;
  }
  if (field->type_ == '\v') {
    pDVar6 = FieldDescriptor::containing_type(field);
    pMVar7 = Descriptor::options(pDVar6);
    bVar1 = MessageOptions::map_entry(pMVar7);
    if (!bVar1) {
      pFVar5 = FieldDescriptor::features(field);
      FVar3 = FeatureSet::message_encoding(pFVar5);
      if (FVar3 == FeatureSet_MessageEncoding_DELIMITED) {
        this_00 = FieldDescriptorProto::type_name_abi_cxx11_((FieldDescriptorProto *)type.ptr_);
        name = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        relative_to = FieldDescriptor::full_name(field);
        local_28 = LookupSymbol(this,name,relative_to,PLACEHOLDER_MESSAGE,LOOKUP_TYPES,false);
        pDVar6 = Symbol::descriptor(&local_28);
        if (pDVar6 != (Descriptor *)0x0) {
          pDVar6 = Symbol::descriptor(&local_28);
          pMVar7 = Descriptor::options(pDVar6);
          bVar1 = MessageOptions::map_entry(pMVar7);
          if (bVar1) goto LAB_001fbc3f;
        }
        field->type_ = '\n';
      }
    }
  }
LAB_001fbc3f:
  bVar1 = FieldOptions::has_ctype(field->options_);
  if (bVar1) {
    FVar4 = FieldOptions::ctype(field->options_);
    field->field_0x3 = field->field_0x3 & 0xf9 | ((byte)FVar4 & 3) << 1;
    FieldOptions::clear_ctype(field->options_);
  }
  return;
}

Assistant:

void DescriptorBuilder::PostProcessFieldFeatures(
    FieldDescriptor& field, const FieldDescriptorProto& proto) {
  // TODO This can be replace by a runtime check in `is_required`
  // once the `label` getter is hidden.
  if (field.features().field_presence() == FeatureSet::LEGACY_REQUIRED &&
      field.label_ == FieldDescriptor::LABEL_OPTIONAL) {
    field.label_ = FieldDescriptor::LABEL_REQUIRED;
  }
  // TODO This can be replace by a runtime check of `is_delimited`
  // once the `TYPE_GROUP` value is removed.
  if (field.type_ == FieldDescriptor::TYPE_MESSAGE &&
      !field.containing_type()->options().map_entry() &&
      field.features().message_encoding() == FeatureSet::DELIMITED) {
    Symbol type =
        LookupSymbol(proto.type_name(), field.full_name(),
                     DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_TYPES, false);
    if (type.descriptor() == nullptr ||
        !type.descriptor()->options().map_entry()) {
      field.type_ = FieldDescriptor::TYPE_GROUP;
    }
  }

  if (field.options_->has_ctype()) {
    field.legacy_proto_ctype_ = field.options_->ctype();
    const_cast<FieldOptions*>(  // NOLINT(google3-runtime-proto-const-cast)
        field.options_)
        ->clear_ctype();
  }
}